

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

ON_SHA1_Hash * __thiscall ON_DimStyle::ContentHash(ON_DimStyle *this)

{
  bool bVar1;
  uint uVar2;
  ON_SHA1_Hash *sub_hash;
  ON_SHA1_Hash local_cc;
  ON_SHA1_Hash local_b8;
  undefined1 local_a4 [8];
  ON_SHA1_Hash text_position_hash;
  ON_SHA1 sha1;
  ON_DimStyle *this_local;
  
  bVar1 = ON_SHA1_Hash::IsEmptyContentHash(&this->m_content_hash);
  if (bVar1) {
    ON_SHA1::ON_SHA1((ON_SHA1 *)(text_position_hash.m_digest + 0xc));
    TextPositionPropertiesHash((ON_SHA1_Hash *)local_a4,this);
    ON_SHA1::AccumulateSubHash
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),(ON_SHA1_Hash *)local_a4);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_arrowsize);
    ON_SHA1::AccumulateDouble
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_leaderarrowsize);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_centermark);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),(uint)this->m_centermark_style);
    ON_SHA1::AccumulateDouble((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_textgap);
    ON_SHA1::AccumulateBool
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),
               (bool)(this->m_bSuppressExtension1 & 1));
    ON_SHA1::AccumulateBool
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),
               (bool)(this->m_bSuppressExtension2 & 1));
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_field_override_parent_count);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_field_override_parent_bits0);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_field_override_parent_bits1);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_field_override_parent_bits2);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_field_override_parent_bits3);
    ON_SHA1::AccumulateDouble
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_baseline_spacing);
    sub_hash = ON_TextMask::ContentHash(&this->m_text_mask);
    ON_SHA1::AccumulateSubHash((ON_SHA1 *)(text_position_hash.m_digest + 0xc),sub_hash);
    ON_ScaleValue::ContentHash(&local_b8,&this->m_scale_value);
    ON_SHA1::AccumulateSubHash((ON_SHA1 *)(text_position_hash.m_digest + 0xc),&local_b8);
    ON_SHA1::AccumulateInteger32
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_dimscale_source);
    ON_SHA1::AccumulateId((ON_SHA1 *)(text_position_hash.m_digest + 0xc),&this->m_source_dimstyle);
    ON_SHA1::AccumulateUnsigned8
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_ext_line_color_source);
    ON_SHA1::AccumulateUnsigned8
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_dim_line_color_source);
    ON_SHA1::AccumulateUnsigned8
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_arrow_color_source);
    ON_SHA1::AccumulateUnsigned8
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_text_color_source);
    uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_ext_line_color);
    ON_SHA1::AccumulateUnsigned32((ON_SHA1 *)(text_position_hash.m_digest + 0xc),uVar2);
    uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_dim_line_color);
    ON_SHA1::AccumulateUnsigned32((ON_SHA1 *)(text_position_hash.m_digest + 0xc),uVar2);
    uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_arrow_color);
    ON_SHA1::AccumulateUnsigned32((ON_SHA1 *)(text_position_hash.m_digest + 0xc),uVar2);
    uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_text_color);
    ON_SHA1::AccumulateUnsigned32((ON_SHA1 *)(text_position_hash.m_digest + 0xc),uVar2);
    ON_SHA1::AccumulateUnsigned8
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_ext_line_plot_color_source);
    ON_SHA1::AccumulateUnsigned8
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_dim_line_plot_color_source);
    ON_SHA1::AccumulateUnsigned8
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_arrow_plot_color_source);
    ON_SHA1::AccumulateUnsigned8
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_text_plot_color_source);
    uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_ext_line_plot_color);
    ON_SHA1::AccumulateUnsigned32((ON_SHA1 *)(text_position_hash.m_digest + 0xc),uVar2);
    uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_dim_line_plot_color);
    ON_SHA1::AccumulateUnsigned32((ON_SHA1 *)(text_position_hash.m_digest + 0xc),uVar2);
    uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_arrow_plot_color);
    ON_SHA1::AccumulateUnsigned32((ON_SHA1 *)(text_position_hash.m_digest + 0xc),uVar2);
    uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_text_plot_color);
    ON_SHA1::AccumulateUnsigned32((ON_SHA1 *)(text_position_hash.m_digest + 0xc),uVar2);
    ON_SHA1::AccumulateUnsigned8
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_ext_line_plot_weight_source);
    ON_SHA1::AccumulateUnsigned8
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_dim_line_plot_weight_source);
    ON_SHA1::AccumulateDouble
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_ext_line_plot_weight_mm);
    ON_SHA1::AccumulateDouble
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_dim_line_plot_weight_mm);
    ON_SHA1::AccumulateDouble
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_fixed_extension_len);
    ON_SHA1::AccumulateBool
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),
               (bool)(this->m_fixed_extension_len_on & 1));
    ON_SHA1::AccumulateBool
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),(bool)(this->m_suppress_arrow1 & 1));
    ON_SHA1::AccumulateBool
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),(bool)(this->m_suppress_arrow2 & 1));
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_arrow_type_1);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_arrow_type_2);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_leader_arrow_type);
    ON_SHA1::AccumulateId((ON_SHA1 *)(text_position_hash.m_digest + 0xc),&this->m_arrow_block_id_1);
    ON_SHA1::AccumulateId((ON_SHA1 *)(text_position_hash.m_digest + 0xc),&this->m_arrow_block_id_2);
    ON_SHA1::AccumulateId
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),&this->m_leader_arrow_block_id);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),
               (uint)this->m_leader_content_angle_style);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),(uint)this->m_leader_curve_type);
    ON_SHA1::AccumulateDouble
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_leader_content_angle);
    ON_SHA1::AccumulateBool
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),(bool)(this->m_leader_has_landing & 1)
              );
    ON_SHA1::AccumulateBool
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),(bool)(this->m_draw_forward & 1));
    ON_SHA1::AccumulateBool
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),(bool)(this->m_signed_ordinate & 1));
    ON_SHA1::AccumulateBool
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),(bool)(this->m_bForceDimLine & 1));
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),(uint)this->m_ArrowFit);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),(uint)this->m_TextFit);
    ON_SHA1::AccumulateUnsigned32
              ((ON_SHA1 *)(text_position_hash.m_digest + 0xc),this->m_decimal_separator);
    ON_SHA1::Hash(&local_cc,(ON_SHA1 *)(text_position_hash.m_digest + 0xc));
    *(undefined8 *)(this->m_content_hash).m_digest = local_cc.m_digest._0_8_;
    *(undefined8 *)((this->m_content_hash).m_digest + 8) = local_cc.m_digest._8_8_;
    *(undefined4 *)((this->m_content_hash).m_digest + 0x10) = local_cc.m_digest._16_4_;
  }
  return &this->m_content_hash;
}

Assistant:

const class ON_SHA1_Hash& ON_DimStyle::ContentHash() const
{
  if (m_content_hash.IsEmptyContentHash())
  {
    ON_SHA1 sha1;

    ON_SHA1_Hash text_position_hash = TextPositionPropertiesHash();
    sha1.AccumulateSubHash(text_position_hash);

    sha1.AccumulateDouble(m_arrowsize);
    sha1.AccumulateDouble(m_leaderarrowsize);
    sha1.AccumulateDouble(m_centermark);
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_centermark_style));
    sha1.AccumulateDouble(m_textgap);

    sha1.AccumulateBool(m_bSuppressExtension1);
    sha1.AccumulateBool(m_bSuppressExtension2);
    sha1.AccumulateUnsigned32(m_field_override_parent_count);
    sha1.AccumulateUnsigned32(m_field_override_parent_bits0);
    sha1.AccumulateUnsigned32(m_field_override_parent_bits1);
    sha1.AccumulateUnsigned32(m_field_override_parent_bits2);
    sha1.AccumulateUnsigned32(m_field_override_parent_bits3);

    sha1.AccumulateDouble(m_baseline_spacing);
    sha1.AccumulateSubHash(m_text_mask.ContentHash());
    sha1.AccumulateSubHash(m_scale_value.ContentHash());
    sha1.AccumulateInteger32(m_dimscale_source);
    sha1.AccumulateId(m_source_dimstyle);
    sha1.AccumulateUnsigned8(m_ext_line_color_source);
    sha1.AccumulateUnsigned8(m_dim_line_color_source);
    sha1.AccumulateUnsigned8(m_arrow_color_source);
    sha1.AccumulateUnsigned8(m_text_color_source);
    sha1.AccumulateUnsigned32(m_ext_line_color);
    sha1.AccumulateUnsigned32(m_dim_line_color);
    sha1.AccumulateUnsigned32(m_arrow_color);
    sha1.AccumulateUnsigned32(m_text_color);
    sha1.AccumulateUnsigned8(m_ext_line_plot_color_source);
    sha1.AccumulateUnsigned8(m_dim_line_plot_color_source);
    sha1.AccumulateUnsigned8(m_arrow_plot_color_source);
    sha1.AccumulateUnsigned8(m_text_plot_color_source);
    sha1.AccumulateUnsigned32(m_ext_line_plot_color);
    sha1.AccumulateUnsigned32(m_dim_line_plot_color);
    sha1.AccumulateUnsigned32(m_arrow_plot_color);
    sha1.AccumulateUnsigned32(m_text_plot_color);
    sha1.AccumulateUnsigned8(m_ext_line_plot_weight_source);
    sha1.AccumulateUnsigned8(m_dim_line_plot_weight_source);
    sha1.AccumulateDouble(m_ext_line_plot_weight_mm);
    sha1.AccumulateDouble(m_dim_line_plot_weight_mm);
    sha1.AccumulateDouble(m_fixed_extension_len);
    sha1.AccumulateBool(m_fixed_extension_len_on);

    sha1.AccumulateBool(m_suppress_arrow1);
    sha1.AccumulateBool(m_suppress_arrow2);

    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_arrow_type_1));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_arrow_type_2));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_leader_arrow_type));
    sha1.AccumulateId(m_arrow_block_id_1);
    sha1.AccumulateId(m_arrow_block_id_2);
    sha1.AccumulateId(m_leader_arrow_block_id);

    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_leader_content_angle_style));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_leader_curve_type));
    sha1.AccumulateDouble(m_leader_content_angle);
    sha1.AccumulateBool(m_leader_has_landing);

    sha1.AccumulateBool(m_draw_forward);
    sha1.AccumulateBool(m_signed_ordinate);

    sha1.AccumulateBool(static_cast<unsigned int>(m_bForceDimLine));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_ArrowFit));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_TextFit));

    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_decimal_separator));

    // Save hash in mutable m_content_hash
    m_content_hash = sha1.Hash();
  }

  return m_content_hash;
}